

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_TreeEnsemble_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003525f8 == '\x01') {
    DAT_003525f8 = '\0';
    (*(code *)*_TreeEnsembleParameters_TreeNode_EvaluationInfo_default_instance_)();
  }
  if (DAT_00352670 == '\x01') {
    DAT_00352670 = '\0';
    (*(code *)*_TreeEnsembleParameters_TreeNode_default_instance_)();
  }
  if (DAT_003526c8 == '\x01') {
    DAT_003526c8 = '\0';
    (*(code *)*_TreeEnsembleParameters_default_instance_)();
  }
  if (DAT_00352700 == '\x01') {
    DAT_00352700 = '\0';
    (*(code *)*_TreeEnsembleClassifier_default_instance_)();
  }
  if (DAT_00352738 == '\x01') {
    DAT_00352738 = 0;
    (*(code *)*_TreeEnsembleRegressor_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _TreeEnsembleParameters_TreeNode_EvaluationInfo_default_instance_.Shutdown();
  _TreeEnsembleParameters_TreeNode_default_instance_.Shutdown();
  _TreeEnsembleParameters_default_instance_.Shutdown();
  _TreeEnsembleClassifier_default_instance_.Shutdown();
  _TreeEnsembleRegressor_default_instance_.Shutdown();
}